

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

void __thiscall cmUVJobServerClient::Impl::ReleaseToken(Impl *this)

{
  uint uVar1;
  
  if (this->HeldTokens == 0) {
    __assert_fail("this->HeldTokens > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx"
                  ,0x4e,"void cmUVJobServerClient::Impl::ReleaseToken()");
  }
  uVar1 = this->HeldTokens - 1;
  this->HeldTokens = uVar1;
  if (uVar1 != 0) {
    (*this->_vptr_Impl[2])();
    return;
  }
  if (this->HeldTokens != 0) {
    __assert_fail("this->HeldTokens == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx"
                  ,0x7e,"void cmUVJobServerClient::Impl::ReleaseImplicitToken()");
  }
  if (this->NeedTokens != 0) {
    DecrementNeedTokens(this);
    RequestImplicitToken(this);
    return;
  }
  return;
}

Assistant:

void cmUVJobServerClient::Impl::ReleaseToken()
{
  assert(this->HeldTokens > 0);
  --this->HeldTokens;
  if (this->HeldTokens == 0) {
    // This was the token implicitly owned by our process.
    this->ReleaseImplicitToken();
  } else {
    // This was a token we received from the job server.  Send it back.
    this->SendToken();
  }
}